

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

string * readable_size_abi_cxx11_(string *__return_storage_ptr__,uint64_t size)

{
  ostream *poVar1;
  char *pcVar2;
  uint uVar3;
  char FILE_SIZE_UNITS [8] [3];
  ostringstream out;
  allocator local_1e9;
  string local_1e8 [32];
  char local_1c8 [32];
  ostringstream local_1a8 [376];
  
  pcVar2 = local_1c8;
  local_1c8[0] = 'B';
  local_1c8[1] = ' ';
  local_1c8[2] = '\0';
  local_1c8[3] = 'K';
  local_1c8[4] = 'B';
  local_1c8[5] = '\0';
  local_1c8[6] = 'M';
  local_1c8[7] = 'B';
  local_1c8[8] = '\0';
  local_1c8[9] = 'G';
  local_1c8[10] = 'B';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = 'T';
  local_1c8[0xd] = 'B';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = 'P';
  local_1c8[0x10] = 'B';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = 'E';
  local_1c8[0x13] = 'B';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = 'Z';
  local_1c8[0x16] = 'B';
  local_1c8[0x17] = '\0';
  uVar3 = 0;
  for (; 0x3ff < size; size = size >> 10) {
    uVar3 = (uint)size & 0x3ff;
    pcVar2 = pcVar2 + 3;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (99 < uVar3) {
    poVar1 = std::operator<<((ostream *)local_1a8,".");
    std::ostream::operator<<((ostream *)poVar1,uVar3 / 100);
  }
  poVar1 = std::operator<<((ostream *)local_1a8," ");
  std::__cxx11::string::string(local_1e8,pcVar2,&local_1e9);
  std::operator<<(poVar1,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string readable_size(uint64_t size)
{
    constexpr const char FILE_SIZE_UNITS[8][3]{"B ", "KB", "MB", "GB", "TB", "PB", "EB", "ZB"};
    uint64_t s = size, r = 0;
    int idx = 0;
    while (s / 1024 > 0)
    {
        r = s % 1024;
        s = s / 1024;
        idx++;
    }
    int point = (int)(r / 100);
    std::ostringstream out;
    out << "" << s;
    if (point != 0)
        out << "." << point;
    out << " " << std::string(FILE_SIZE_UNITS[idx]);
    return out.str();
}